

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_compareCString_firstGreaterThanSecond_fn(int _i)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined8 uStack_b0;
  AString string3;
  AString string2;
  AString string1;
  
  string1.reallocator = private_ACUtilsTest_AString_realloc;
  string1.deallocator = private_ACUtilsTest_AString_free;
  string1.size = 1;
  string1.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_b0 = 0x149ffe;
  string1.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string1.buffer[0] = 'a';
  string1.buffer[1] = '\0';
  string2.reallocator = private_ACUtilsTest_AString_realloc;
  string2.deallocator = private_ACUtilsTest_AString_free;
  string2.size = 1;
  string2.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_b0 = 0x14a03d;
  string2.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string2.buffer[0] = 'b';
  string2.buffer[1] = '\0';
  string3.reallocator = private_ACUtilsTest_AString_realloc;
  string3.deallocator = private_ACUtilsTest_AString_free;
  string3.size = 2;
  string3.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_b0 = 0x14a080;
  string3.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  string3.buffer[2] = '\0';
  string3.buffer[0] = 'b';
  string3.buffer[1] = 'a';
  private_ACUtilsTest_AString_reallocFail = 0;
  pcVar4 = "";
  uStack_b0 = 0x14a0b3;
  iVar1 = AString_compareCString(&string1,"");
  if (iVar1 < 1) {
    local_c8 = (char *)(long)iVar1;
    ppcVar5 = &local_c8;
    local_c0 = "0";
    pcVar3 = "Assertion \'_ck_x > _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar6 = "AString_compareCString(&string1, \"\") > 0";
    pcVar7 = "AString_compareCString(&string1, \"\")";
    iVar1 = 0x93c;
    goto LAB_0014aabf;
  }
  uStack_b0 = 0x14a0cc;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x93c);
  if (string1.capacity != 8) {
    pcVar4 = "(string1).capacity == (8)";
    pcVar3 = "(string1).capacity";
    iVar1 = 0x93d;
    local_c8 = (char *)string1.capacity;
LAB_0014a991:
    local_c0 = "(8)";
    local_b8 = (char *)0x8;
    goto LAB_0014aa72;
  }
  uStack_b0 = 0x14a0ec;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x93d);
  if (string1.buffer == (char *)0x0) {
    ppcVar5 = &local_b8;
    pcVar3 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar6 = "(void*) (string1).buffer != NULL";
    pcVar7 = "(void*) (string1).buffer";
    iVar1 = 0x93d;
    goto LAB_0014aabf;
  }
  uStack_b0 = 0x14a10c;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x93d);
  if (string1.buffer == (char *)0x0) {
    pcVar3 = "(null)";
LAB_0014a528:
    uStack_b0 = 0;
    local_b8 = "\"";
    local_c0 = "a";
    local_c8 = "\"";
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x93d,
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                      "(string1).buffer == (\"a\")","(string1).buffer",pcVar4,pcVar3,pcVar4,
                      "(\"a\")");
  }
  uVar2 = (byte)*string1.buffer - 0x61;
  if (uVar2 == 0) {
    uVar2 = (uint)(byte)string1.buffer[1];
  }
  if (uVar2 != 0) {
    pcVar4 = "\"";
    pcVar3 = string1.buffer;
    goto LAB_0014a528;
  }
  uStack_b0 = 0x14a146;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x93d);
  if (string1.size != 1) {
    local_c0 = "(string1).size == strlen(\"a\")";
    pcVar4 = "(string1).size == strlen(\"a\")";
    pcVar3 = "(string1).size";
    iVar1 = 0x93d;
    local_c8 = (char *)string1.size;
LAB_0014a736:
    local_c0 = local_c0 + 0x12;
    local_b8 = (char *)0x1;
    goto LAB_0014aa72;
  }
  uStack_b0 = 0x14a166;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x93d);
  if (private_ACUtilsTest_AString_reallocCount != 0) {
    ppcVar5 = &local_c8;
    local_c0 = "(0)";
    local_c8 = (char *)private_ACUtilsTest_AString_reallocCount;
    pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
    pcVar7 = "private_ACUtilsTest_AString_reallocCount";
    iVar1 = 0x93e;
LAB_0014aabf:
    uStack_b0 = 0;
    local_b8 = (char *)0x0;
    *(code **)((long)ppcVar5 + -8) = test_AString_compareCString_nullptr_fn;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar1,pcVar3,pcVar4,pcVar6,pcVar7);
  }
  uStack_b0 = 0x14a187;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x93e);
  uStack_b0 = 0x14a198;
  iVar1 = AString_compareCString(&string2,"a");
  if (iVar1 < 1) {
    local_c8 = (char *)(long)iVar1;
    ppcVar5 = &local_c8;
    local_c0 = "0";
    pcVar3 = "Assertion \'_ck_x > _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
    pcVar6 = "AString_compareCString(&string2, \"a\") > 0";
    pcVar7 = "AString_compareCString(&string2, \"a\")";
    iVar1 = 0x93f;
    goto LAB_0014aabf;
  }
  uStack_b0 = 0x14a1b1;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x93f);
  if (string2.capacity != 8) {
    pcVar4 = "(string2).capacity == (8)";
    pcVar3 = "(string2).capacity";
    iVar1 = 0x940;
    local_c8 = (char *)string2.capacity;
    goto LAB_0014a991;
  }
  uStack_b0 = 0x14a1d1;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x940);
  if (string2.buffer == (char *)0x0) {
    ppcVar5 = &local_b8;
    pcVar3 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar6 = "(void*) (string2).buffer != NULL";
    pcVar7 = "(void*) (string2).buffer";
    iVar1 = 0x940;
    goto LAB_0014aabf;
  }
  uStack_b0 = 0x14a1ee;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x940);
  if (string2.buffer == (char *)0x0) {
    pcVar3 = "";
    pcVar4 = "(null)";
  }
  else {
    uVar2 = (byte)*string2.buffer - 0x62;
    if (uVar2 == 0) {
      uVar2 = (uint)(byte)string2.buffer[1];
    }
    if (uVar2 == 0) {
      uStack_b0 = 0x14a225;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x940);
      if (string2.size != 1) {
        local_c0 = "(string2).size == strlen(\"b\")";
        pcVar4 = "(string2).size == strlen(\"b\")";
        pcVar3 = "(string2).size";
        iVar1 = 0x940;
        local_c8 = (char *)string2.size;
        goto LAB_0014a736;
      }
      uStack_b0 = 0x14a245;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x940);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        ppcVar5 = &local_c8;
        local_c0 = "(0)";
        local_c8 = (char *)private_ACUtilsTest_AString_reallocCount;
        pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
        pcVar7 = "private_ACUtilsTest_AString_reallocCount";
        iVar1 = 0x941;
        goto LAB_0014aabf;
      }
      uStack_b0 = 0x14a266;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x941);
      uStack_b0 = 0x14a275;
      iVar1 = AString_compareCString(&string3,"a");
      if (iVar1 < 1) {
        local_c8 = (char *)(long)iVar1;
        ppcVar5 = &local_c8;
        local_c0 = "0";
        pcVar3 = "Assertion \'_ck_x > _ck_y\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
        pcVar6 = "AString_compareCString(&string3, \"a\") > 0";
        pcVar7 = "AString_compareCString(&string3, \"a\")";
        iVar1 = 0x942;
        goto LAB_0014aabf;
      }
      uStack_b0 = 0x14a28e;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x942);
      if (string3.capacity != 8) {
        pcVar4 = "(string3).capacity == (8)";
        pcVar3 = "(string3).capacity";
        iVar1 = 0x943;
        local_c8 = (char *)string3.capacity;
        goto LAB_0014a991;
      }
      uStack_b0 = 0x14a2ae;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x943);
      if (string3.buffer == (char *)0x0) {
        ppcVar5 = &local_b8;
        pcVar3 = "Assertion \'_ck_x != NULL\' failed";
        pcVar4 = "Assertion \'%s\' failed: %s == %#x";
        pcVar6 = "(void*) (string3).buffer != NULL";
        pcVar7 = "(void*) (string3).buffer";
        iVar1 = 0x943;
        goto LAB_0014aabf;
      }
      uStack_b0 = 0x14a2cb;
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x943);
      if (string3.buffer == (char *)0x0) {
        pcVar3 = "";
        pcVar4 = "(null)";
      }
      else {
        uVar2 = (byte)*string3.buffer - 0x62;
        if ((uVar2 == 0) && (uVar2 = (byte)string3.buffer[1] - 0x61, uVar2 == 0)) {
          uVar2 = (uint)(byte)string3.buffer[2];
        }
        if (uVar2 == 0) {
          uStack_b0 = 0x14a30c;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x943);
          if (string3.size != 2) {
            iVar1 = 0x943;
LAB_0014aa6c:
            local_c0 = "strlen(\"ba\")";
            pcVar3 = "(string3).size";
            pcVar4 = "(string3).size == strlen(\"ba\")";
            local_b8 = (char *)0x2;
            local_c8 = (char *)string3.size;
LAB_0014aa72:
            uStack_b0 = 0;
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,iVar1,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",pcVar4,pcVar3);
          }
          uStack_b0 = 0x14a32c;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x943);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            ppcVar5 = &local_c8;
            local_c0 = "(0)";
            local_c8 = (char *)private_ACUtilsTest_AString_reallocCount;
            pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar7 = "private_ACUtilsTest_AString_reallocCount";
            iVar1 = 0x944;
            goto LAB_0014aabf;
          }
          uStack_b0 = 0x14a34d;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x944);
          uStack_b0 = 0x14a35c;
          iVar1 = AString_compareCString(&string3,"b");
          if (iVar1 < 1) {
            local_c8 = (char *)(long)iVar1;
            ppcVar5 = &local_c8;
            local_c0 = "0";
            pcVar3 = "Assertion \'_ck_x > _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %jd, %s == %jd";
            pcVar6 = "AString_compareCString(&string3, \"b\") > 0";
            pcVar7 = "AString_compareCString(&string3, \"b\")";
            iVar1 = 0x945;
            goto LAB_0014aabf;
          }
          uStack_b0 = 0x14a375;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x945);
          if (string3.capacity != 8) {
            pcVar4 = "(string3).capacity == (8)";
            pcVar3 = "(string3).capacity";
            iVar1 = 0x946;
            local_c8 = (char *)string3.capacity;
            goto LAB_0014a991;
          }
          uStack_b0 = 0x14a395;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x946);
          if (string3.buffer == (char *)0x0) {
            ppcVar5 = &local_b8;
            pcVar3 = "Assertion \'_ck_x != NULL\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %#x";
            pcVar6 = "(void*) (string3).buffer != NULL";
            pcVar7 = "(void*) (string3).buffer";
            iVar1 = 0x946;
            goto LAB_0014aabf;
          }
          uStack_b0 = 0x14a3b2;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x946);
          if (string3.buffer == (char *)0x0) {
            pcVar4 = "(null)";
            pcVar3 = "";
          }
          else {
            uVar2 = (byte)*string3.buffer - 0x62;
            if ((uVar2 == 0) && (uVar2 = (byte)string3.buffer[1] - 0x61, uVar2 == 0)) {
              uVar2 = (uint)(byte)string3.buffer[2];
            }
            if (uVar2 == 0) {
              uStack_b0 = 0x14a3f3;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x946);
              if (string3.size == 2) {
                uStack_b0 = 0x14a413;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x946);
                if (private_ACUtilsTest_AString_reallocCount == 0) {
                  uStack_b0 = 0x14a434;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x947);
                  uStack_b0 = 0x14a440;
                  (*string1.deallocator)(string1.buffer);
                  uStack_b0 = 0x14a449;
                  (*string2.deallocator)(string2.buffer);
                  uStack_b0 = 0x14a452;
                  (*string3.deallocator)(string3.buffer);
                  return;
                }
                ppcVar5 = &local_c8;
                local_c0 = "(0)";
                local_c8 = (char *)private_ACUtilsTest_AString_reallocCount;
                pcVar3 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar6 = "private_ACUtilsTest_AString_reallocCount == (0)";
                pcVar7 = "private_ACUtilsTest_AString_reallocCount";
                iVar1 = 0x947;
                goto LAB_0014aabf;
              }
              iVar1 = 0x946;
              goto LAB_0014aa6c;
            }
            pcVar3 = "\"";
            pcVar4 = string3.buffer;
          }
          local_c0 = "ba";
          pcVar8 = "(\"ba\")";
          pcVar6 = "(string3).buffer == (\"ba\")";
          pcVar7 = "(string3).buffer";
          iVar1 = 0x946;
          goto LAB_0014aa28;
        }
        pcVar3 = "\"";
        pcVar4 = string3.buffer;
      }
      local_c0 = "ba";
      pcVar8 = "(\"ba\")";
      pcVar6 = "(string3).buffer == (\"ba\")";
      pcVar7 = "(string3).buffer";
      iVar1 = 0x943;
      goto LAB_0014aa28;
    }
    pcVar3 = "\"";
    pcVar4 = string2.buffer;
  }
  local_c0 = "b";
  pcVar8 = "(\"b\")";
  pcVar6 = "(string2).buffer == (\"b\")";
  pcVar7 = "(string2).buffer";
  iVar1 = 0x940;
LAB_0014aa28:
  uStack_b0 = 0;
  local_b8 = "\"";
  local_c8 = "\"";
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",pcVar6,pcVar7,pcVar3,
                    pcVar4,pcVar3,pcVar8);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}